

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_search.c
# Opt level: O1

REF_STATUS
ref_search_distance3(REF_DBL *xyz0,REF_DBL *xyz1,REF_DBL *xyz2,REF_DBL *xyz,REF_DBL *distance)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  double dVar9;
  double dVar10;
  double dVar11;
  double dVar12;
  double dVar13;
  double dVar14;
  double dVar15;
  double dVar16;
  double dVar17;
  double dVar18;
  double dVar19;
  double dVar20;
  double dVar21;
  double dVar22;
  double dVar23;
  REF_DBL dist;
  REF_DBL local_38;
  
  dVar8 = *xyz1;
  dVar13 = xyz1[1];
  dVar11 = *xyz0;
  dVar1 = xyz0[1];
  dVar22 = dVar8 - dVar11;
  dVar7 = dVar13 - dVar1;
  dVar2 = xyz1[2];
  dVar3 = xyz0[2];
  dVar21 = dVar2 - dVar3;
  dVar4 = *xyz2;
  dVar5 = xyz2[1];
  dVar9 = dVar5 - dVar1;
  dVar6 = xyz2[2];
  dVar14 = dVar6 - dVar3;
  dVar16 = dVar7 * dVar14 - dVar9 * dVar21;
  dVar10 = dVar4 - dVar11;
  dVar19 = dVar21 * dVar10 - dVar14 * dVar22;
  dVar23 = dVar22 * dVar9 - dVar10 * dVar7;
  dVar17 = *xyz - dVar11;
  dVar15 = xyz[1] - dVar1;
  dVar12 = xyz[2] - dVar3;
  dVar20 = dVar12 * dVar23 + dVar17 * dVar16 + dVar15 * dVar19;
  dVar18 = (dVar17 - dVar16 * dVar20) + dVar11;
  dVar17 = (dVar15 - dVar19 * dVar20) + dVar1;
  dVar12 = (dVar12 - dVar20 * dVar23) + dVar3;
  dVar15 = ((dVar5 - dVar17) * (dVar8 - dVar18) - (dVar4 - dVar18) * (dVar13 - dVar17)) * dVar23 +
           ((dVar13 - dVar17) * (dVar6 - dVar12) - (dVar5 - dVar17) * (dVar2 - dVar12)) * dVar16 +
           ((dVar2 - dVar12) * (dVar4 - dVar18) - (dVar6 - dVar12) * (dVar8 - dVar18)) * dVar19;
  dVar18 = dVar18 - dVar11;
  dVar17 = dVar17 - dVar1;
  dVar12 = dVar12 - dVar3;
  dVar10 = (dVar18 * dVar9 - dVar10 * dVar17) * dVar23 +
           (dVar17 * dVar14 - dVar9 * dVar12) * dVar16 +
           (dVar12 * dVar10 - dVar14 * dVar18) * dVar19;
  dVar12 = (dVar17 * dVar22 - dVar18 * dVar7) * dVar23 +
           (dVar7 * dVar12 - dVar17 * dVar21) * dVar16 +
           (dVar21 * dVar18 - dVar12 * dVar22) * dVar19;
  dVar9 = dVar15 + dVar10 + dVar12;
  dVar7 = dVar9 * 1e+20;
  if (dVar7 <= -dVar7) {
    dVar7 = -dVar7;
  }
  dVar14 = dVar15;
  if (dVar15 <= -dVar15) {
    dVar14 = -dVar15;
  }
  if (dVar14 < dVar7) {
    dVar14 = dVar10;
    if (dVar10 <= -dVar10) {
      dVar14 = -dVar10;
    }
    if (dVar14 < dVar7) {
      dVar14 = dVar12;
      if (dVar12 <= -dVar12) {
        dVar14 = -dVar12;
      }
      if ((((dVar14 < dVar7) && (dVar12 = dVar12 / dVar9, 0.0 <= dVar12)) &&
          (dVar15 = dVar15 / dVar9, 0.0 <= dVar15)) && (dVar10 = dVar10 / dVar9, 0.0 <= dVar10)) {
        dVar11 = (dVar4 * dVar12 + dVar11 * dVar15 + dVar8 * dVar10) - *xyz;
        dVar13 = (dVar5 * dVar12 + dVar1 * dVar15 + dVar13 * dVar10) - xyz[1];
        dVar8 = (dVar6 * dVar12 + dVar3 * dVar15 + dVar2 * dVar10) - xyz[2];
        dVar8 = dVar8 * dVar8 + dVar11 * dVar11 + dVar13 * dVar13;
        if (dVar8 < 0.0) {
          dVar8 = sqrt(dVar8);
        }
        else {
          dVar8 = SQRT(dVar8);
        }
        goto LAB_00192e21;
      }
    }
  }
  ref_search_distance2(xyz0,xyz1,xyz,&local_38);
  *distance = local_38;
  ref_search_distance2(xyz1,xyz2,xyz,&local_38);
  dVar8 = *distance;
  if (local_38 <= *distance) {
    dVar8 = local_38;
  }
  *distance = dVar8;
  ref_search_distance2(xyz2,xyz0,xyz,&local_38);
  dVar8 = *distance;
  if (local_38 <= *distance) {
    dVar8 = local_38;
  }
LAB_00192e21:
  *distance = dVar8;
  return 0;
}

Assistant:

REF_FCN REF_STATUS ref_search_distance3(REF_DBL *xyz0, REF_DBL *xyz1,
                                        REF_DBL *xyz2, REF_DBL *xyz,
                                        REF_DBL *distance) {
  REF_DBL dist;
  REF_DBL bary[3], total, total_normal[3], normal[3];
  REF_DBL dxyz[3];
  REF_DBL xyzp[3];

  RSS(ref_search_xyz_normal(xyz0, xyz1, xyz2, total_normal), "n0");

  /* projects query point to triangle plane */
  xyzp[0] = xyz[0] - xyz0[0];
  xyzp[1] = xyz[1] - xyz0[1];
  xyzp[2] = xyz[2] - xyz0[2];
  total = ref_math_dot(xyzp, total_normal);
  xyzp[0] -= total_normal[0] * total;
  xyzp[1] -= total_normal[1] * total;
  xyzp[2] -= total_normal[2] * total;
  xyzp[0] += xyz0[0];
  xyzp[1] += xyz0[1];
  xyzp[2] += xyz0[2];

  RSS(ref_search_xyz_normal(xyzp, xyz1, xyz2, normal), "n0");
  bary[0] = ref_math_dot(normal, total_normal);
  RSS(ref_search_xyz_normal(xyz0, xyzp, xyz2, normal), "n1");
  bary[1] = ref_math_dot(normal, total_normal);
  RSS(ref_search_xyz_normal(xyz0, xyz1, xyzp, normal), "n2");
  bary[2] = ref_math_dot(normal, total_normal);

  total = bary[0] + bary[1] + bary[2];

  if (ref_math_divisible(bary[0], total) &&
      ref_math_divisible(bary[1], total) &&
      ref_math_divisible(bary[2], total)) {
    bary[0] /= total;
    bary[1] /= total;
    bary[2] /= total;
    if (bary[0] >= 0.0 && bary[1] >= 0.0 && bary[2] >= 0.0) {
      dxyz[0] =
          bary[0] * xyz0[0] + bary[1] * xyz1[0] + bary[2] * xyz2[0] - xyz[0];
      dxyz[1] =
          bary[0] * xyz0[1] + bary[1] * xyz1[1] + bary[2] * xyz2[1] - xyz[1];
      dxyz[2] =
          bary[0] * xyz0[2] + bary[1] * xyz1[2] + bary[2] * xyz2[2] - xyz[2];
      *distance = sqrt(ref_math_dot(dxyz, dxyz));
      return REF_SUCCESS;
    }
  }

  RSS(ref_search_distance2(xyz0, xyz1, xyz, &dist), "e01");
  *distance = dist;
  RSS(ref_search_distance2(xyz1, xyz2, xyz, &dist), "e12");
  *distance = MIN(*distance, dist);
  RSS(ref_search_distance2(xyz2, xyz0, xyz, &dist), "e20");
  *distance = MIN(*distance, dist);

  return REF_SUCCESS;
}